

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprCodeGetColumnOfTable(Vdbe *v,Table *pTab,int iTabCur,int iCol,int regOut)

{
  byte *pbVar1;
  ushort uVar2;
  sqlite3 *db;
  Parse *pParse;
  ExprList *pEVar3;
  Op *pOVar4;
  i16 iVar5;
  Mem *in_RAX;
  Index *pIVar6;
  short *psVar7;
  int iVar8;
  int iVar9;
  Expr *pExpr;
  long lVar10;
  ValueNewStat4Ctx *in_R9;
  Column *pCVar11;
  sqlite3_value *local_38;
  
  local_38 = in_RAX;
  if ((iCol < 0) || (pTab->iPKey == iCol)) {
    iVar9 = 0x87;
    iVar8 = regOut;
  }
  else {
    iVar9 = 0xaf;
    iVar8 = iCol;
    if (pTab->eTabType != '\x01') {
      uVar2 = pTab->aCol[(uint)iCol].colFlags;
      if ((uVar2 & 0x20) != 0) {
        pCVar11 = pTab->aCol + (uint)iCol;
        pParse = v->pParse;
        if ((uVar2 >> 8 & 1) == 0) {
          iVar8 = pParse->iSelfTab;
          pCVar11->colFlags = uVar2 | 0x100;
          pParse->iSelfTab = iTabCur + 1;
          sqlite3ExprCodeGeneratedColumn(pParse,pTab,pCVar11,regOut);
          pParse->iSelfTab = iVar8;
          pbVar1 = (byte *)((long)&pCVar11->colFlags + 1);
          *pbVar1 = *pbVar1 & 0xfe;
          return;
        }
        sqlite3ErrorMsg(pParse,"generated column loop on \"%s\"",pCVar11->zCnName);
        return;
      }
      if ((pTab->tabFlags & 0x80) == 0) {
        iVar5 = sqlite3TableColumnToStorage(pTab,(short)iCol);
        iVar8 = (int)iVar5;
        iVar9 = 0x5e;
      }
      else {
        for (pIVar6 = pTab->pIndex;
            (pIVar6 != (Index *)0x0 && ((*(ushort *)&pIVar6->field_0x63 & 3) != 2));
            pIVar6 = pIVar6->pNext) {
        }
        iVar9 = 0x5e;
        if (pIVar6->nColumn != 0) {
          psVar7 = pIVar6->aiColumn;
          lVar10 = 0;
          do {
            if (*psVar7 == (short)iCol) {
              iVar8 = (int)lVar10 >> 0x10;
              goto LAB_001757c3;
            }
            lVar10 = lVar10 + 0x10000;
            psVar7 = psVar7 + 1;
          } while ((ulong)pIVar6->nColumn * 0x10000 != lVar10);
        }
        iVar8 = -1;
      }
    }
LAB_001757c3:
    sqlite3VdbeAddOp3(v,iVar9,iTabCur,iVar8,regOut);
    pCVar11 = pTab->aCol;
    uVar2 = pCVar11[(uint)iCol].iDflt;
    if (uVar2 != 0) {
      local_38 = (Mem *)0x0;
      if (((pTab->eTabType == '\0') && (pEVar3 = (pTab->u).tab.pDfltList, pEVar3 != (ExprList *)0x0)
          ) && ((int)(uint)uVar2 <= pEVar3->nExpr)) {
        pExpr = pEVar3->a[uVar2 - 1].pExpr;
      }
      else {
        pExpr = (Expr *)0x0;
      }
      if (pExpr != (Expr *)0x0) {
        valueFromExpr(v->db,pExpr,v->db->enc,pCVar11[(uint)iCol].affinity,&local_38,in_R9);
      }
      if (local_38 != (Mem *)0x0) {
        db = v->db;
        if (db->mallocFailed == '\0') {
          pOVar4 = v->aOp;
          iVar8 = v->nOp;
          pOVar4[(long)iVar8 + -1].p4type = -10;
          pOVar4[(long)iVar8 + -1].p4.pMem = local_38;
        }
        else if (db->pnBytesFreed == (int *)0x0) {
          sqlite3ValueFree(local_38);
        }
        else {
          freeP4Mem(db,local_38);
        }
      }
    }
    if ((pCVar11[(uint)iCol].affinity != 'E') || (pTab->eTabType == '\x01')) {
      return;
    }
    iVar9 = 0x57;
    iVar8 = 0;
    iTabCur = regOut;
  }
  sqlite3VdbeAddOp3(v,iVar9,iTabCur,iVar8,0);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCodeGetColumnOfTable(
  Vdbe *v,        /* Parsing context */
  Table *pTab,    /* The table containing the value */
  int iTabCur,    /* The table cursor.  Or the PK cursor for WITHOUT ROWID */
  int iCol,       /* Index of the column to extract */
  int regOut      /* Extract the value into this register */
){
  Column *pCol;
  assert( v!=0 );
  assert( pTab!=0 );
  assert( iCol!=XN_EXPR );
  if( iCol<0 || iCol==pTab->iPKey ){
    sqlite3VdbeAddOp2(v, OP_Rowid, iTabCur, regOut);
    VdbeComment((v, "%s.rowid", pTab->zName));
  }else{
    int op;
    int x;
    if( IsVirtual(pTab) ){
      op = OP_VColumn;
      x = iCol;
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
    }else if( (pCol = &pTab->aCol[iCol])->colFlags & COLFLAG_VIRTUAL ){
      Parse *pParse = sqlite3VdbeParser(v);
      if( pCol->colFlags & COLFLAG_BUSY ){
        sqlite3ErrorMsg(pParse, "generated column loop on \"%s\"",
                        pCol->zCnName);
      }else{
        int savedSelfTab = pParse->iSelfTab;
        pCol->colFlags |= COLFLAG_BUSY;
        pParse->iSelfTab = iTabCur+1;
        sqlite3ExprCodeGeneratedColumn(pParse, pTab, pCol, regOut);
        pParse->iSelfTab = savedSelfTab;
        pCol->colFlags &= ~COLFLAG_BUSY;
      }
      return;
#endif
    }else if( !HasRowid(pTab) ){
      testcase( iCol!=sqlite3TableColumnToStorage(pTab, iCol) );
      x = sqlite3TableColumnToIndex(sqlite3PrimaryKeyIndex(pTab), iCol);
      op = OP_Column;
    }else{
      x = sqlite3TableColumnToStorage(pTab,iCol);
      testcase( x!=iCol );
      op = OP_Column;
    }
    sqlite3VdbeAddOp3(v, op, iTabCur, x, regOut);
    sqlite3ColumnDefault(v, pTab, iCol, regOut);
  }
}